

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitRefNull(PrintExpressionContents *this,RefNull *curr)

{
  ostream *o;
  HeapType type;
  string_view local_28;
  RefNull *local_18;
  RefNull *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (RefNull *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"ref.null ");
  printMedium(o,local_28);
  type = wasm::Type::getHeapType
                   (&(local_18->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression
                     .type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitRefNull(RefNull* curr) {
    printMedium(o, "ref.null ");
    printHeapTypeName(curr->type.getHeapType());
  }